

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall helics::apps::Clone::getValue_abi_cxx11_(Clone *this,int index)

{
  bool bVar1;
  const_reference __elements;
  Input *this_00;
  string *this_01;
  int in_EDX;
  long in_RSI;
  tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_20 [12];
  int local_14;
  
  local_14 = in_EDX;
  bVar1 = isValidIndex<int,std::vector<helics::apps::Clone::ValueCapture,std::allocator<helics::apps::Clone::ValueCapture>>>
                    ((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                      *)in_stack_ffffffffffffff68);
  if (bVar1) {
    __elements = CLI::std::
                 vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                 ::operator[]((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                               *)(in_RSI + 0xb8),(long)local_14);
    this_00 = (Input *)(in_RSI + 0xd0);
    CLI::std::
    vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
    operator[]((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                *)(in_RSI + 0xb8),(long)local_14);
    CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::operator[]
              ((deque<helics::Input,_std::allocator<helics::Input>_> *)this_00,
               (size_type)in_stack_ffffffffffffff68);
    this_01 = Input::getTarget_abi_cxx11_(this_00);
    CLI::std::
    vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>::
    operator[]((vector<helics::apps::Clone::ValueCapture,_std::allocator<helics::apps::Clone::ValueCapture>_>
                *)(in_RSI + 0xb8),(long)local_14);
    CLI::std::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple<true,_true>((tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_01,&__elements->time,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
                        ,in_stack_ffffffffffffff68);
  }
  else {
    memset(local_20,0,8);
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
    std::__cxx11::string::string(in_stack_ffffffffffffff80);
    CLI::std::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<TimeRepresentation<count_time<9,_long>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  }
  return in_RDI;
}

Assistant:

std::tuple<Time, std::string, std::string> Clone::getValue(int index) const
{
    if (isValidIndex(index, points)) {
        return {points[index].time,
                subscriptions[points[index].index].getTarget(),
                points[index].value};
    }
    return {Time(), std::string(), std::string()};
}